

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O0

void __thiscall
Equality_importSourceEqual_Test::~Equality_importSourceEqual_Test
          (Equality_importSourceEqual_Test *this)

{
  Equality_importSourceEqual_Test *this_local;
  
  ~Equality_importSourceEqual_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Equality, importSourceEqual)
{
    libcellml::ImportSourcePtr is1 = libcellml::ImportSource::create();
    libcellml::ImportSourcePtr is2 = libcellml::ImportSource::create();

    is1->setUrl("great_url");
    is2->setUrl("great_url");

    EXPECT_TRUE(is1->equals(is2));
    EXPECT_TRUE(is2->equals(is1));
}